

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLURL::parse(XMLURL *this,XMLCh *urlText)

{
  short *psVar1;
  XMLCh XVar2;
  Protocols PVar3;
  MemoryManager *pMVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  MalformedURLException *pMVar7;
  XMLCh *pXVar8;
  XMLCh *pXVar9;
  XMLCh *pXVar10;
  undefined4 extraout_var_01;
  XMLCh *__dest;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  size_t sVar11;
  long lVar12;
  ArrayJanitor<char16_t> janSrcCopy;
  ArrayJanitor<char16_t> local_40;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  if (*urlText == L'\0') {
    pMVar7 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x3a8,URL_NoProtocolPresent,this->fMemoryManager);
LAB_00257363:
    __cxa_throw(pMVar7,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  bVar5 = XMLUri::isURIString(urlText);
  this->fHasInvalidChar = !bVar5;
  if ((((ushort)((*urlText & 0xffdfU) - 0x41U) < 0x1a) && (urlText[1] == L':')) &&
     ((urlText[2] == L'\\' || (urlText[2] == L'/')))) {
    pMVar7 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x3bd,URL_NoProtocolPresent,this->fMemoryManager);
    goto LAB_00257363;
  }
  sVar11 = 0;
  do {
    psVar1 = (short *)((long)urlText + sVar11);
    sVar11 = sVar11 + 2;
  } while (*psVar1 != 0);
  iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
  pXVar9 = (XMLCh *)CONCAT44(extraout_var,iVar6);
  memcpy(pXVar9,urlText,sVar11);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,pXVar9,this->fMemoryManager);
  XVar2 = *pXVar9;
  while( true ) {
    if (XVar2 == L'\0') {
      pMVar7 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x3d6,URL_NoProtocolPresent,this->fMemoryManager);
      __cxa_throw(pMVar7,&MalformedURLException::typeinfo,XMLException::~XMLException);
    }
    if (-1 < (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)XVar2]) break;
    XVar2 = pXVar9[1];
    pXVar9 = pXVar9 + 1;
  }
  pXVar8 = XMLString::findAny(pXVar9,L":/");
  if ((pXVar8 != (XMLCh *)0x0) && (*pXVar8 == L':')) {
    *pXVar8 = L'\0';
    lVar12 = 8;
    do {
      iVar6 = XMLString::compareIStringASCII(pXVar9,*(XMLCh **)((long)&gProtoList + lVar12));
      if (iVar6 == 0) {
        PVar3 = *(Protocols *)(&UNK_00402538 + lVar12);
        this->fProtocol = PVar3;
        if (PVar3 == Unknown) goto LAB_00256e52;
        pXVar9 = pXVar8 + 1;
        goto LAB_00256eb8;
      }
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x68);
    this->fProtocol = Unknown;
LAB_00256e52:
    pMVar7 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar7,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x3f3,URL_UnsupportedProto1,pXVar9,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
LAB_00256e8e:
    __cxa_throw(pMVar7,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
LAB_00256eb8:
  if ((*pXVar9 == L'/') && (pXVar9[1] == L'/')) {
    pXVar8 = pXVar9 + 2;
    if (pXVar9[2] != L'\0') {
      pXVar9 = XMLString::findAny(pXVar8,L"/");
      if (pXVar9 == (XMLCh *)0x0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
        sVar11 = 0;
        do {
          psVar1 = (short *)((long)pXVar8 + sVar11);
          sVar11 = sVar11 + 2;
        } while (*psVar1 != 0);
        iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
        pXVar9 = (XMLCh *)CONCAT44(extraout_var_01,iVar6);
        memcpy(pXVar9,pXVar8,sVar11);
        this->fHost = pXVar9;
        lVar12 = 0;
        if (pXVar9 != (XMLCh *)0x0) {
          do {
            psVar1 = (short *)((long)pXVar9 + lVar12);
            lVar12 = lVar12 + 2;
          } while (*psVar1 != 0);
          lVar12 = (lVar12 >> 1) + -1;
        }
        pXVar8 = pXVar8 + lVar12;
      }
      else if ((long)pXVar9 - (long)pXVar8 != 0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
        iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                          (this->fMemoryManager,((long)pXVar9 - (long)pXVar8) + 2);
        pXVar10 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
        this->fHost = pXVar10;
        for (; pXVar8 < pXVar9; pXVar8 = pXVar8 + 1) {
          *pXVar10 = *pXVar8;
          pXVar10 = pXVar10 + 1;
        }
        *pXVar10 = L'\0';
      }
    }
  }
  else {
    pXVar8 = pXVar9;
    if (this->fProtocol == HTTP) {
      pMVar7 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x438,URL_ExpectingTwoSlashes,this->fMemoryManager);
      goto LAB_00256e8e;
    }
  }
  if (this->fHost == (XMLCh *)0x0) {
LAB_0025713b:
    if (*pXVar8 == L'\0') goto LAB_002572f4;
  }
  else {
    pXVar9 = XMLString::findAny(this->fHost,L"@");
    if (pXVar9 != (XMLCh *)0x0) {
      *pXVar9 = L'\0';
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUser);
      pXVar10 = this->fHost;
      if (pXVar10 == (XMLCh *)0x0) {
        pXVar10 = (XMLCh *)0x0;
        __dest = (XMLCh *)0x0;
      }
      else {
        sVar11 = 0;
        do {
          psVar1 = (short *)((long)pXVar10 + sVar11);
          sVar11 = sVar11 + 2;
        } while (*psVar1 != 0);
        iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
        __dest = (XMLCh *)CONCAT44(extraout_var_02,iVar6);
        memcpy(__dest,pXVar10,sVar11);
        pXVar10 = this->fHost;
      }
      this->fUser = __dest;
      XMLString::cut(pXVar10,(long)pXVar9 + (2 - (long)pXVar10) >> 1);
      pXVar9 = XMLString::findAny(this->fUser,L":");
      if (pXVar9 != (XMLCh *)0x0) {
        *pXVar9 = L'\0';
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPassword);
        sVar11 = 0;
        do {
          psVar1 = (short *)((long)(pXVar9 + 1) + sVar11);
          sVar11 = sVar11 + 2;
        } while (*psVar1 != 0);
        iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
        memcpy((XMLCh *)CONCAT44(extraout_var_03,iVar6),pXVar9 + 1,sVar11);
        this->fPassword = (XMLCh *)CONCAT44(extraout_var_03,iVar6);
      }
    }
    pXVar9 = XMLString::findAny(this->fHost,L":");
    if (pXVar9 != (XMLCh *)0x0) {
      *pXVar9 = L'\0';
      bVar5 = XMLString::textToBin(pXVar9 + 1,&this->fPortNum,this->fMemoryManager);
      if (!bVar5) {
        pMVar7 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar7,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                   ,0x46f,URL_BadPortField,this->fMemoryManager);
        goto LAB_00256e8e;
      }
    }
    if (*this->fHost == L'\0') {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
      this->fHost = (XMLCh *)0x0;
      goto LAB_0025713b;
    }
    if (*pXVar8 == L'\0') {
      iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,4);
      pXVar9 = (XMLCh *)CONCAT44(extraout_var_04,iVar6);
      pXVar9[0] = L'/';
      pXVar9[1] = L'\0';
      this->fPath = pXVar9;
      goto LAB_002572f4;
    }
  }
  pXVar9 = XMLString::findAny(pXVar8,L"#?");
  if (pXVar9 == (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
    sVar11 = 0;
    do {
      psVar1 = (short *)((long)pXVar8 + sVar11);
      sVar11 = sVar11 + 2;
    } while (*psVar1 != 0);
    iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
    memcpy((XMLCh *)CONCAT44(extraout_var_07,iVar6),pXVar8,sVar11);
    this->fPath = (XMLCh *)CONCAT44(extraout_var_07,iVar6);
    goto LAB_002572f4;
  }
  if (pXVar8 <= pXVar9 && (long)pXVar9 - (long)pXVar8 != 0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
    iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,((long)pXVar9 - (long)pXVar8) + 2);
    pXVar10 = (XMLCh *)CONCAT44(extraout_var_05,iVar6);
    this->fPath = pXVar10;
    do {
      XVar2 = *pXVar8;
      pXVar8 = pXVar8 + 1;
      *pXVar10 = XVar2;
      pXVar10 = pXVar10 + 1;
    } while (pXVar8 < pXVar9);
    *pXVar10 = L'\0';
  }
  if (*pXVar8 == L'#') {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fFragment);
    pXVar8 = pXVar8 + 1;
    sVar11 = 0;
    do {
      psVar1 = (short *)((long)pXVar8 + sVar11);
      sVar11 = sVar11 + 2;
    } while (*psVar1 != 0);
    iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
    pXVar9 = (XMLCh *)CONCAT44(extraout_var_06,iVar6);
  }
  else {
    pXVar8 = pXVar8 + 1;
    pXVar9 = XMLString::findAny(pXVar8,L"#");
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fQuery);
    pMVar4 = this->fMemoryManager;
    if (pXVar9 == (XMLCh *)0x0) {
      sVar11 = 0;
      do {
        psVar1 = (short *)((long)pXVar8 + sVar11);
        sVar11 = sVar11 + 2;
      } while (*psVar1 != 0);
      iVar6 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4,sVar11);
      memcpy((XMLCh *)CONCAT44(extraout_var_10,iVar6),pXVar8,sVar11);
      this->fQuery = (XMLCh *)CONCAT44(extraout_var_10,iVar6);
      goto LAB_002572f4;
    }
    iVar6 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4,(long)pXVar9 + (2 - (long)pXVar8));
    pXVar10 = (XMLCh *)CONCAT44(extraout_var_08,iVar6);
    this->fQuery = pXVar10;
    for (; pXVar8 < pXVar9; pXVar8 = pXVar8 + 1) {
      *pXVar10 = *pXVar8;
      pXVar10 = pXVar10 + 1;
    }
    *pXVar10 = L'\0';
    if (*pXVar8 != L'#') goto LAB_002572f4;
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fFragment);
    pXVar8 = pXVar8 + 1;
    sVar11 = 0;
    do {
      psVar1 = (short *)((long)pXVar8 + sVar11);
      sVar11 = sVar11 + 2;
    } while (*psVar1 != 0);
    iVar6 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
    pXVar9 = (XMLCh *)CONCAT44(extraout_var_09,iVar6);
  }
  memcpy(pXVar9,pXVar8,sVar11);
  this->fFragment = pXVar9;
LAB_002572f4:
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return;
}

Assistant:

void XMLURL::parse(const XMLCh* const urlText)
{
    // Simplify things by checking for the psycho scenarios first
    if (!*urlText)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);

    // Before we start, check if this urlText contains valid uri characters
    if (!XMLUri::isURIString(urlText))
        fHasInvalidChar = true;
    else
        fHasInvalidChar = false;

    //
    //  The first thing we will do is to check for a file name, so that
    //  we don't waste time thinking its a URL. If its in the form x:\ or x:/
    //  and x is an ASCII letter, then assume that's the deal.
    //
    if (((*urlText >= chLatin_A) && (*urlText <= chLatin_Z))
    ||  ((*urlText >= chLatin_a) && (*urlText <= chLatin_z)))
    {
        if (*(urlText + 1) == chColon)
        {
            if ((*(urlText + 2) == chForwardSlash)
            ||  (*(urlText + 2) == chBackSlash))
            {
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);
            }
        }
    }

    // Get a copy of the URL that we can modify
    XMLCh* srcCpy = XMLString::replicate(urlText, fMemoryManager);
    ArrayJanitor<XMLCh> janSrcCopy(srcCpy, fMemoryManager);

    //
    //  Get a pointer now that we can run up thrown the source as we parse
    //  bits and pieces out of it.
    //
    XMLCh* srcPtr = srcCpy;

    // Run up past any spaces
    while (*srcPtr)
    {
        if (!XMLChar1_0::isWhitespace(*srcPtr))
            break;
        srcPtr++;
    }

    // Make sure it wasn't all space
    if (!*srcPtr)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);

    //
    //  Ok, the next thing we have to do is to find either a / or : character.
    //  If the : is first, we assume we have a protocol. If the / is first,
    //  then we skip to the host processing.
    //
    XMLCh* ptr1 = XMLString::findAny(srcPtr, gListOne);
    XMLCh* ptr2;

    // If we found a protocol, then deal with it
    if (ptr1)
    {
        if (*ptr1 == chColon)
        {
            // Cap the string at the colon
            *ptr1 = 0;

            // And try to find it in our list of protocols
            fProtocol = lookupByName(srcPtr);

            if (fProtocol == Unknown)
            {
                ThrowXMLwithMemMgr1
                (
                    MalformedURLException
                    , XMLExcepts::URL_UnsupportedProto1
                    , srcPtr
                    , fMemoryManager
                );
            }

            // And move our source pointer up past what we've processed
            srcPtr = (ptr1 + 1);
        }
    }

    //
    //  Ok, next we need to see if we have any host part. If the next
    //  two characters are //, then we need to check, else move on.
    //
    if ((*srcPtr == chForwardSlash) && (*(srcPtr + 1) == chForwardSlash))
    {
        // Move up past the slashes
        srcPtr += 2;

        //
        //  If we aren't at the end of the string, then there has to be a
        //  host part at this point. we will just look for the next / char
        //  or end of string and make all of that the host for now.
        //
        if (*srcPtr)
        {
            // Search from here for a / character
            ptr1 = XMLString::findAny(srcPtr, gListFour);

            //
            //  If we found something, then the host is between where
            //  we are and what we found. Else the host is the rest of
            //  the content and we are done. If its empty, leave it null.
            //
            if (ptr1)
            {
                if (ptr1 != srcPtr)
                {
                    fMemoryManager->deallocate(fHost);//delete [] fHost;
                    fHost = (XMLCh*) fMemoryManager->allocate
                    (
                        ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
                    );//new XMLCh[(ptr1 - srcPtr) + 1];
                    ptr2 = fHost;
                    while (srcPtr < ptr1)
                        *ptr2++ = *srcPtr++;
                    *ptr2 = 0;
                }
            }
             else
            {
                fMemoryManager->deallocate(fHost);//delete [] fHost;
                fHost = XMLString::replicate(srcPtr, fMemoryManager);

                // Update source pointer to the end
                srcPtr += XMLString::stringLen(fHost);
            }
        }
    }
    else
    {
        //
        // http protocol requires two forward slashes
        // we didn't get them, so throw an exception
        //
        if (fProtocol == HTTP) {
            ThrowXMLwithMemMgr
                (
                    MalformedURLException
                    , XMLExcepts::URL_ExpectingTwoSlashes
                    , fMemoryManager
                );
        }
    }

    //
    //  If there was a host part, then we have to grovel through it for
    //  all the bits and pieces it can hold.
    //
    if (fHost)
    {
        //
        //  Look for a '@' character, which indicates a user name. If we
        //  find one, then everything between the start of the host data
        //  and the character is the user name.
        //
        ptr1 = XMLString::findAny(fHost, gListTwo);
        if (ptr1)
        {
            // Get this info out as the user name
            *ptr1 = 0;
            fMemoryManager->deallocate(fUser);//delete [] fUser;
            fUser = XMLString::replicate(fHost, fMemoryManager);
            ptr1++;

            // And now cut these chars from the host string
            XMLString::cut(fHost, ptr1 - fHost);

            // Is there a password inside the user string?
            ptr2 = XMLString::findAny(fUser, gListThree);
            if (ptr2)
            {
                // Remove it from the user name string
                *ptr2 = 0;

                // And copy out the remainder to the password field
                ptr2++;
                fMemoryManager->deallocate(fPassword);//delete [] fPassword;
                fPassword = XMLString::replicate(ptr2, fMemoryManager);
            }
        }

        //
        //  Ok, so now we are at the actual host name, if any. If we are
        //  not at the end of the host data, then lets see if we have a
        //  port trailing the
        //
        ptr1 = XMLString::findAny(fHost, gListThree);
        if (ptr1)
        {
            // Remove it from the host name
            *ptr1 = 0;

            // Try to convert it to a numeric port value and store it
            ptr1++;
            if (!XMLString::textToBin(ptr1, fPortNum, fMemoryManager))
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_BadPortField, fMemoryManager);
        }

        // If the host ended up empty, then toss is
        if (!*fHost)
        {
            fMemoryManager->deallocate(fHost);//delete[] fHost;
            fHost = 0;
        }
    }

    // If we are at the end, then we are done now
    if (!*srcPtr) {
        if(fHost) {
            static const XMLCh slash[] = { chForwardSlash, chNull };
            fPath = XMLString::replicate(slash, fMemoryManager);
        }
        return;
    }

    //
    //  Next is the path part. It can be absolute, i.e. starting with a
    //  forward slash character, or relative. Its basically everything up
    //  to the end of the string or to any trailing query or fragment.
    //
    ptr1 = XMLString::findAny(srcPtr, gListFive);
    if (!ptr1)
    {
        fMemoryManager->deallocate(fPath);//delete [] fPath;
        fPath = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }

    // Everything from where we are to what we found is the path
    if (ptr1 > srcPtr)
    {
        fMemoryManager->deallocate(fPath);//delete [] fPath;
        fPath = (XMLCh*) fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = fPath;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    //
    //  If we found a fragment, then it is the rest of the string and we
    //  are done.
    //
    if (*srcPtr == chPound)
    {
        srcPtr++;
        fMemoryManager->deallocate(fFragment);//delete [] fFragment;
        fFragment = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }

    //
    //  The query is either the rest of the string, or up to the fragment
    //  separator.
    //
    srcPtr++;
    ptr1 = XMLString::findAny(srcPtr, gListSix);
    fMemoryManager->deallocate(fQuery);//delete [] fQuery;
    if (!ptr1)
    {
        fQuery = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }
     else
    {
        fQuery = (XMLCh*) fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = fQuery;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    // If we are not at the end now, then everything else is the fragment
    if (*srcPtr == chPound)
    {
        srcPtr++;
        fMemoryManager->deallocate(fFragment);//delete [] fFragment;
        fFragment = XMLString::replicate(srcPtr, fMemoryManager);
    }
}